

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::Api::_InternalSerialize(Api *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  SourceContext *value;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Method>_> *value_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Option>_> *value_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Mixin>_> *value_02;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  char *in_R9;
  uint uVar7;
  string *_s;
  undefined8 *puVar8;
  byte *pbVar9;
  string_view s;
  string_view s_00;
  string_view field_name;
  string_view field_name_00;
  
  if ((undefined1  [112])((undefined1  [112])this->field_0 & (undefined1  [112])0x1) !=
      (undefined1  [112])0x0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    if ((char *)puVar8[1] != (char *)0x0) {
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.Api.name";
      protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar8,(char *)puVar8[1],1,0x18,field_name);
      s._M_str = (char *)*puVar8;
      s._M_len = puVar8[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  if (iVar1 != 0) {
    iVar6 = 0;
    do {
      value_00 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Method>>
                           (&(this->field_0)._impl_.methods_.super_RepeatedPtrFieldBase,iVar6);
      target = protobuf::internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar1 != 0) {
    iVar6 = 0;
    do {
      value_01 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Option>>
                           (&(this->field_0)._impl_.options_.super_RepeatedPtrFieldBase,iVar6);
      target = protobuf::internal::WireFormatLite::InternalWriteMessage
                         (3,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  uVar7 = *(uint *)&this->field_0;
  if ((uVar7 & 2) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.version_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    if ((char *)puVar8[1] != (char *)0x0) {
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)"google.protobuf.Api.version";
      protobuf::internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar8,(char *)puVar8[1],1,0x1b,field_name_00);
      s_00._M_str = (char *)*puVar8;
      s_00._M_len = puVar8[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,4,s_00,target);
      uVar7 = *(uint *)&this->field_0;
    }
  }
  if ((uVar7 & 4) != 0) {
    value = (this->field_0)._impl_.source_context_;
    target = protobuf::internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar1 != 0) {
    iVar6 = 0;
    do {
      value_02 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Mixin>>
                           (&(this->field_0)._impl_.mixins_.super_RepeatedPtrFieldBase,iVar6);
      target = protobuf::internal::WireFormatLite::InternalWriteMessage
                         (6,(MessageLite *)value_02,(value_02->field_0)._impl_._cached_size_.atom_,
                          target,stream);
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  if (((uVar7 & 8) != 0) && (uVar7 = (this->field_0)._impl_.syntax_, uVar7 != 0)) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar7 = (this->field_0)._impl_.syntax_;
    }
    *target = 0x38;
    pbVar9 = target + 1;
    uVar4 = (ulong)(int)uVar7;
    uVar5 = uVar4;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar2);
    }
    *pbVar9 = (byte)uVar4;
    target = pbVar9 + 1;
  }
  uVar5 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    puVar3 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Api::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Api& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Api)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_name().empty()) {
      const ::std::string& _s = this_._internal_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Api.name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  // repeated .google.protobuf.Method methods = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_methods_size());
       i < n; i++) {
    const auto& repfield = this_._internal_methods().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Option options = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_options_size());
       i < n; i++) {
    const auto& repfield = this_._internal_options().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // string version = 4;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._internal_version().empty()) {
      const ::std::string& _s = this_._internal_version();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Api.version");
      target = stream->WriteStringMaybeAliased(4, _s, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // .google.protobuf.SourceContext source_context = 5;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.source_context_, this_._impl_.source_context_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.Mixin mixins = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_mixins_size());
       i < n; i++) {
    const auto& repfield = this_._internal_mixins().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .google.protobuf.Syntax syntax = 7;
  if ((cached_has_bits & 0x00000008u) != 0) {
    if (this_._internal_syntax() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          7, this_._internal_syntax(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Api)
  return target;
}